

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers_test.cpp
# Opt level: O2

void __thiscall PowerLightSampling_PdfMethod_Test::TestBody(PowerLightSampling_PdfMethod_Test *this)

{
  pointer pLVar1;
  memory_resource *pmVar2;
  Allocator alloc;
  SampledLight *pSVar3;
  Message *message;
  Allocator alloc_00;
  int iVar4;
  char *message_00;
  char *in_R9;
  long lVar5;
  float u;
  undefined1 auVar6 [16];
  Float actual;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  span<const_pbrt::LightHandle> lights_00;
  AssertHelper local_1a8;
  AssertionResult gtest_ar_;
  AssertHelper local_190;
  undefined1 local_188 [16];
  Point3f p;
  undefined1 local_168 [16];
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_150;
  vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_> tris;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  undefined1 local_110 [24];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  optional<pbrt::SampledLight> sampledLight;
  RNG rng;
  PowerLightSampler distrib;
  undefined1 extraout_var [60];
  
  pbrt::RNG::SetSequence(&rng,0x1483);
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar2 = pstd::pmr::new_delete_resource();
  randomLights((tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
                *)&distrib,(int)pmVar2,alloc_00);
  local_110._8_8_ = &lights;
  local_110._0_8_ = &tris;
  std::
  tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
  ::operator=((tuple<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::vector<pbrt::ShapeHandle,std::allocator<pbrt::ShapeHandle>>&>
               *)local_110,
              (tuple<std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
               *)&distrib);
  std::
  _Tuple_impl<0UL,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>,_std::vector<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>_>
                  *)&distrib);
  pLVar1 = lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  lights_00.n = lVar5 >> 3;
  lights_00.ptr = pLVar1;
  pbrt::PowerLightSampler::PowerLightSampler(&distrib,lights_00,alloc);
  iVar4 = 0;
  do {
    if (iVar4 == 100) {
LAB_0031000f:
      pbrt::PowerLightSampler::~PowerLightSampler(&distrib);
      std::_Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>::~_Vector_base
                (&tris.super__Vector_base<pbrt::ShapeHandle,_std::allocator<pbrt::ShapeHandle>_>);
      std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
                (&lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>);
      return;
    }
    local_188._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    local_188._4_4_ = extraout_XMM0_Db;
    local_188._8_4_ = extraout_XMM0_Dc;
    local_188._12_4_ = extraout_XMM0_Dd;
    local_188 = vfmadd132ss_fma(local_188,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40400000));
    local_168._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    local_168._4_4_ = extraout_XMM0_Db_00;
    local_168._8_4_ = extraout_XMM0_Dc_00;
    local_168._12_4_ = extraout_XMM0_Dd_00;
    auVar7._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar7._4_60_ = extraout_var;
    auVar10 = vfmadd213ss_fma(local_168,SUB6416(ZEXT464(0x40400000),0),
                              SUB6416(ZEXT464(0xbf800000),0));
    auVar6 = vfmadd213ss_fma(auVar7._0_16_,SUB6416(ZEXT464(0x40400000),0),
                             SUB6416(ZEXT464(0xbf800000),0));
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_188._0_4_;
    fVar9 = auVar10._0_4_;
    auVar10._0_4_ = auVar6._0_4_;
    p.super_Tuple3<pbrt::Point3,_float>.y = fVar9;
    p.super_Tuple3<pbrt::Point3,_float>.z = auVar10._0_4_;
    u = pbrt::RNG::Uniform<float>(&rng);
    pbrt::PowerLightSampler::Sample(&sampledLight,&distrib,u);
    gtest_ar_.success_ = sampledLight.set;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (sampledLight.set == false) {
      testing::Message::Message((Message *)&local_1a8);
      std::ostream::operator<<(&(local_1a8.data_)->line,iVar4);
      std::operator<<((ostream *)&(local_1a8.data_)->line," - ");
      message = testing::Message::operator<<((Message *)&local_1a8,&p);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&gtest_ar_,(AssertionResult *)"(bool)sampledLight",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lightsamplers_test.cpp"
                 ,0x159,(char *)local_110._0_8_);
      testing::internal::AssertHelper::operator=(&local_190,message);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      std::__cxx11::string::~string((string *)local_110);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
      goto LAB_0031000f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pSVar3 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    auVar6._4_4_ = local_188._0_4_;
    auVar6._0_4_ = local_188._0_4_;
    auVar6._8_4_ = local_188._0_4_;
    auVar6._12_4_ = local_188._0_4_;
    auVar8._4_4_ = fVar9;
    auVar8._0_4_ = fVar9;
    auVar8._8_4_ = fVar9;
    auVar8._12_4_ = fVar9;
    auVar10._4_4_ = auVar10._0_4_;
    auVar10._8_4_ = auVar10._0_4_;
    auVar10._12_4_ = auVar10._0_4_;
    local_188._0_4_ = pSVar3->pdf;
    local_110._0_16_ = vmovlhps_avx(auVar6,auVar8);
    local_110._16_8_ = vmovlps_avx(auVar10);
    local_e8._0_4_ = 0.0;
    local_e8._4_4_ = 0.0;
    local_f8 = ZEXT816(0) << 0x20;
    pSVar3 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    local_150.bits =
         (pSVar3->light).
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    actual = pbrt::PowerLightSampler::PDF
                       (&distrib,(LightSampleContext *)local_110,(LightHandle *)&local_150);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar_,"sampledLight->pdf","distrib.PDF(intr, sampledLight->light)",
               (float)local_188._0_4_,actual);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)local_110);
      message_00 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lightsamplers_test.cpp"
                 ,0x15a,message_00);
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_110);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

TEST(PowerLightSampling, PdfMethod) {
    RNG rng(5251);
    auto r = [&rng]() { return rng.Uniform<Float>(); };

    std::vector<LightHandle> lights;
    std::vector<ShapeHandle> tris;
    std::tie(lights, tris) = randomLights(20, Allocator());

    PowerLightSampler distrib(lights, Allocator());
    for (int i = 0; i < 100; ++i) {
        Point3f p(-1 + 3 * r(), -1 + 3 * r(), -1 + 3 * r());
        Interaction intr(Point3fi(p), Normal3f(0, 0, 0), Point2f(0, 0));
        pstd::optional<SampledLight> sampledLight =
            distrib.Sample(intr, rng.Uniform<Float>());
        ASSERT_TRUE((bool)sampledLight) << i << " - " << p;
        EXPECT_FLOAT_EQ(sampledLight->pdf, distrib.PDF(intr, sampledLight->light));
    }
}